

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

string * __thiscall
Highs::presolveStatusToString_abi_cxx11_(Highs *this,HighsPresolveStatus presolve_status)

{
  undefined4 in_EDX;
  string *in_RDI;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [21];
  
  switch(in_EDX) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Not reduced",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Infeasible",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Unbounded or infeasible",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Reduced",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Reduced to empty",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Timeout",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Unrecognised presolve status",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Memory allocation error",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case 0xffffffff:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Not presolved",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
  }
  return in_RDI;
}

Assistant:

std::string Highs::presolveStatusToString(
    const HighsPresolveStatus presolve_status) const {
  switch (presolve_status) {
    case HighsPresolveStatus::kNotPresolved:
      return "Not presolved";
    case HighsPresolveStatus::kNotReduced:
      return "Not reduced";
    case HighsPresolveStatus::kInfeasible:
      return "Infeasible";
    case HighsPresolveStatus::kUnboundedOrInfeasible:
      return "Unbounded or infeasible";
    case HighsPresolveStatus::kReduced:
      return "Reduced";
    case HighsPresolveStatus::kReducedToEmpty:
      return "Reduced to empty";
    case HighsPresolveStatus::kTimeout:
      return "Timeout";
    case HighsPresolveStatus::kOutOfMemory:
      return "Memory allocation error";
    default:
      assert(1 == 0);
      return "Unrecognised presolve status";
  }
}